

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O2

string * GetOpName_abi_cxx11_(string *__return_storage_ptr__,opcodetype opcode)

{
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(opcode) {
  case OP_0:
    __s = "0";
    break;
  default:
    __s = "OP_UNKNOWN";
    break;
  case OP_PUSHDATA1:
    __s = "OP_PUSHDATA1";
    break;
  case OP_PUSHDATA2:
    __s = "OP_PUSHDATA2";
    break;
  case OP_PUSHDATA4:
    __s = "OP_PUSHDATA4";
    break;
  case OP_1NEGATE:
    __s = "-1";
    break;
  case OP_RESERVED:
    __s = "OP_RESERVED";
    break;
  case OP_1:
    __s = "1";
    break;
  case OP_2:
    __s = "2";
    break;
  case OP_3:
    __s = "3";
    break;
  case OP_4:
    __s = "4";
    break;
  case OP_5:
    __s = "5";
    break;
  case OP_6:
    __s = "6";
    break;
  case OP_7:
    __s = "7";
    break;
  case OP_8:
    __s = "8";
    break;
  case OP_9:
    __s = "9";
    break;
  case OP_10:
    __s = "10";
    break;
  case OP_11:
    __s = "11";
    break;
  case OP_12:
    __s = "12";
    break;
  case OP_13:
    __s = "13";
    break;
  case OP_14:
    __s = "14";
    break;
  case OP_15:
    __s = "15";
    break;
  case OP_16:
    __s = "16";
    break;
  case OP_NOP:
    __s = "OP_NOP";
    break;
  case OP_VER:
    __s = "OP_VER";
    break;
  case OP_IF:
    __s = "OP_IF";
    break;
  case OP_NOTIF:
    __s = "OP_NOTIF";
    break;
  case OP_VERIF:
    __s = "OP_VERIF";
    break;
  case OP_VERNOTIF:
    __s = "OP_VERNOTIF";
    break;
  case OP_ELSE:
    __s = "OP_ELSE";
    break;
  case OP_ENDIF:
    __s = "OP_ENDIF";
    break;
  case OP_VERIFY:
    __s = "OP_VERIFY";
    break;
  case OP_RETURN:
    __s = "OP_RETURN";
    break;
  case OP_TOALTSTACK:
    __s = "OP_TOALTSTACK";
    break;
  case OP_FROMALTSTACK:
    __s = "OP_FROMALTSTACK";
    break;
  case OP_2DROP:
    __s = "OP_2DROP";
    break;
  case OP_2DUP:
    __s = "OP_2DUP";
    break;
  case OP_3DUP:
    __s = "OP_3DUP";
    break;
  case OP_2OVER:
    __s = "OP_2OVER";
    break;
  case OP_2ROT:
    __s = "OP_2ROT";
    break;
  case OP_2SWAP:
    __s = "OP_2SWAP";
    break;
  case OP_IFDUP:
    __s = "OP_IFDUP";
    break;
  case OP_DEPTH:
    __s = "OP_DEPTH";
    break;
  case OP_DROP:
    __s = "OP_DROP";
    break;
  case OP_DUP:
    __s = "OP_DUP";
    break;
  case OP_NIP:
    __s = "OP_NIP";
    break;
  case OP_OVER:
    __s = "OP_OVER";
    break;
  case OP_PICK:
    __s = "OP_PICK";
    break;
  case OP_ROLL:
    __s = "OP_ROLL";
    break;
  case OP_ROT:
    __s = "OP_ROT";
    break;
  case OP_SWAP:
    __s = "OP_SWAP";
    break;
  case OP_TUCK:
    __s = "OP_TUCK";
    break;
  case OP_CAT:
    __s = "OP_CAT";
    break;
  case OP_SUBSTR:
    __s = "OP_SUBSTR";
    break;
  case OP_LEFT:
    __s = "OP_LEFT";
    break;
  case OP_RIGHT:
    __s = "OP_RIGHT";
    break;
  case OP_SIZE:
    __s = "OP_SIZE";
    break;
  case OP_INVERT:
    __s = "OP_INVERT";
    break;
  case OP_AND:
    __s = "OP_AND";
    break;
  case OP_OR:
    __s = "OP_OR";
    break;
  case OP_XOR:
    __s = "OP_XOR";
    break;
  case OP_EQUAL:
    __s = "OP_EQUAL";
    break;
  case OP_EQUALVERIFY:
    __s = "OP_EQUALVERIFY";
    break;
  case OP_RESERVED1:
    __s = "OP_RESERVED1";
    break;
  case OP_RESERVED2:
    __s = "OP_RESERVED2";
    break;
  case OP_1ADD:
    __s = "OP_1ADD";
    break;
  case OP_1SUB:
    __s = "OP_1SUB";
    break;
  case OP_2MUL:
    __s = "OP_2MUL";
    break;
  case OP_2DIV:
    __s = "OP_2DIV";
    break;
  case OP_NEGATE:
    __s = "OP_NEGATE";
    break;
  case OP_ABS:
    __s = "OP_ABS";
    break;
  case OP_NOT:
    __s = "OP_NOT";
    break;
  case OP_0NOTEQUAL:
    __s = "OP_0NOTEQUAL";
    break;
  case OP_ADD:
    __s = "OP_ADD";
    break;
  case OP_SUB:
    __s = "OP_SUB";
    break;
  case OP_MUL:
    __s = "OP_MUL";
    break;
  case OP_DIV:
    __s = "OP_DIV";
    break;
  case OP_MOD:
    __s = "OP_MOD";
    break;
  case OP_LSHIFT:
    __s = "OP_LSHIFT";
    break;
  case OP_RSHIFT:
    __s = "OP_RSHIFT";
    break;
  case OP_BOOLAND:
    __s = "OP_BOOLAND";
    break;
  case OP_BOOLOR:
    __s = "OP_BOOLOR";
    break;
  case OP_NUMEQUAL:
    __s = "OP_NUMEQUAL";
    break;
  case OP_NUMEQUALVERIFY:
    __s = "OP_NUMEQUALVERIFY";
    break;
  case OP_NUMNOTEQUAL:
    __s = "OP_NUMNOTEQUAL";
    break;
  case OP_LESSTHAN:
    __s = "OP_LESSTHAN";
    break;
  case OP_GREATERTHAN:
    __s = "OP_GREATERTHAN";
    break;
  case OP_LESSTHANOREQUAL:
    __s = "OP_LESSTHANOREQUAL";
    break;
  case OP_GREATERTHANOREQUAL:
    __s = "OP_GREATERTHANOREQUAL";
    break;
  case OP_MIN:
    __s = "OP_MIN";
    break;
  case OP_MAX:
    __s = "OP_MAX";
    break;
  case OP_WITHIN:
    __s = "OP_WITHIN";
    break;
  case OP_RIPEMD160:
    __s = "OP_RIPEMD160";
    break;
  case OP_SHA1:
    __s = "OP_SHA1";
    break;
  case OP_SHA256:
    __s = "OP_SHA256";
    break;
  case OP_HASH160:
    __s = "OP_HASH160";
    break;
  case OP_HASH256:
    __s = "OP_HASH256";
    break;
  case OP_CODESEPARATOR:
    __s = "OP_CODESEPARATOR";
    break;
  case OP_CHECKSIG:
    __s = "OP_CHECKSIG";
    break;
  case OP_CHECKSIGVERIFY:
    __s = "OP_CHECKSIGVERIFY";
    break;
  case OP_CHECKMULTISIG:
    __s = "OP_CHECKMULTISIG";
    break;
  case OP_CHECKMULTISIGVERIFY:
    __s = "OP_CHECKMULTISIGVERIFY";
    break;
  case OP_NOP1:
    __s = "OP_NOP1";
    break;
  case OP_CHECKLOCKTIMEVERIFY:
    __s = "OP_CHECKLOCKTIMEVERIFY";
    break;
  case OP_CHECKSEQUENCEVERIFY:
    __s = "OP_CHECKSEQUENCEVERIFY";
    break;
  case OP_NOP4:
    __s = "OP_NOP4";
    break;
  case OP_NOP5:
    __s = "OP_NOP5";
    break;
  case OP_NOP6:
    __s = "OP_NOP6";
    break;
  case OP_NOP7:
    __s = "OP_NOP7";
    break;
  case OP_NOP8:
    __s = "OP_NOP8";
    break;
  case OP_NOP9:
    __s = "OP_NOP9";
    break;
  case OP_NOP10:
    __s = "OP_NOP10";
    break;
  case OP_CHECKSIGADD:
    __s = "OP_CHECKSIGADD";
    break;
  case OP_INVALIDOPCODE:
    __s = "OP_INVALIDOPCODE";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_11)
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::string GetOpName(opcodetype opcode)
{
    switch (opcode)
    {
    // push value
    case OP_0                      : return "0";
    case OP_PUSHDATA1              : return "OP_PUSHDATA1";
    case OP_PUSHDATA2              : return "OP_PUSHDATA2";
    case OP_PUSHDATA4              : return "OP_PUSHDATA4";
    case OP_1NEGATE                : return "-1";
    case OP_RESERVED               : return "OP_RESERVED";
    case OP_1                      : return "1";
    case OP_2                      : return "2";
    case OP_3                      : return "3";
    case OP_4                      : return "4";
    case OP_5                      : return "5";
    case OP_6                      : return "6";
    case OP_7                      : return "7";
    case OP_8                      : return "8";
    case OP_9                      : return "9";
    case OP_10                     : return "10";
    case OP_11                     : return "11";
    case OP_12                     : return "12";
    case OP_13                     : return "13";
    case OP_14                     : return "14";
    case OP_15                     : return "15";
    case OP_16                     : return "16";

    // control
    case OP_NOP                    : return "OP_NOP";
    case OP_VER                    : return "OP_VER";
    case OP_IF                     : return "OP_IF";
    case OP_NOTIF                  : return "OP_NOTIF";
    case OP_VERIF                  : return "OP_VERIF";
    case OP_VERNOTIF               : return "OP_VERNOTIF";
    case OP_ELSE                   : return "OP_ELSE";
    case OP_ENDIF                  : return "OP_ENDIF";
    case OP_VERIFY                 : return "OP_VERIFY";
    case OP_RETURN                 : return "OP_RETURN";

    // stack ops
    case OP_TOALTSTACK             : return "OP_TOALTSTACK";
    case OP_FROMALTSTACK           : return "OP_FROMALTSTACK";
    case OP_2DROP                  : return "OP_2DROP";
    case OP_2DUP                   : return "OP_2DUP";
    case OP_3DUP                   : return "OP_3DUP";
    case OP_2OVER                  : return "OP_2OVER";
    case OP_2ROT                   : return "OP_2ROT";
    case OP_2SWAP                  : return "OP_2SWAP";
    case OP_IFDUP                  : return "OP_IFDUP";
    case OP_DEPTH                  : return "OP_DEPTH";
    case OP_DROP                   : return "OP_DROP";
    case OP_DUP                    : return "OP_DUP";
    case OP_NIP                    : return "OP_NIP";
    case OP_OVER                   : return "OP_OVER";
    case OP_PICK                   : return "OP_PICK";
    case OP_ROLL                   : return "OP_ROLL";
    case OP_ROT                    : return "OP_ROT";
    case OP_SWAP                   : return "OP_SWAP";
    case OP_TUCK                   : return "OP_TUCK";

    // splice ops
    case OP_CAT                    : return "OP_CAT";
    case OP_SUBSTR                 : return "OP_SUBSTR";
    case OP_LEFT                   : return "OP_LEFT";
    case OP_RIGHT                  : return "OP_RIGHT";
    case OP_SIZE                   : return "OP_SIZE";

    // bit logic
    case OP_INVERT                 : return "OP_INVERT";
    case OP_AND                    : return "OP_AND";
    case OP_OR                     : return "OP_OR";
    case OP_XOR                    : return "OP_XOR";
    case OP_EQUAL                  : return "OP_EQUAL";
    case OP_EQUALVERIFY            : return "OP_EQUALVERIFY";
    case OP_RESERVED1              : return "OP_RESERVED1";
    case OP_RESERVED2              : return "OP_RESERVED2";

    // numeric
    case OP_1ADD                   : return "OP_1ADD";
    case OP_1SUB                   : return "OP_1SUB";
    case OP_2MUL                   : return "OP_2MUL";
    case OP_2DIV                   : return "OP_2DIV";
    case OP_NEGATE                 : return "OP_NEGATE";
    case OP_ABS                    : return "OP_ABS";
    case OP_NOT                    : return "OP_NOT";
    case OP_0NOTEQUAL              : return "OP_0NOTEQUAL";
    case OP_ADD                    : return "OP_ADD";
    case OP_SUB                    : return "OP_SUB";
    case OP_MUL                    : return "OP_MUL";
    case OP_DIV                    : return "OP_DIV";
    case OP_MOD                    : return "OP_MOD";
    case OP_LSHIFT                 : return "OP_LSHIFT";
    case OP_RSHIFT                 : return "OP_RSHIFT";
    case OP_BOOLAND                : return "OP_BOOLAND";
    case OP_BOOLOR                 : return "OP_BOOLOR";
    case OP_NUMEQUAL               : return "OP_NUMEQUAL";
    case OP_NUMEQUALVERIFY         : return "OP_NUMEQUALVERIFY";
    case OP_NUMNOTEQUAL            : return "OP_NUMNOTEQUAL";
    case OP_LESSTHAN               : return "OP_LESSTHAN";
    case OP_GREATERTHAN            : return "OP_GREATERTHAN";
    case OP_LESSTHANOREQUAL        : return "OP_LESSTHANOREQUAL";
    case OP_GREATERTHANOREQUAL     : return "OP_GREATERTHANOREQUAL";
    case OP_MIN                    : return "OP_MIN";
    case OP_MAX                    : return "OP_MAX";
    case OP_WITHIN                 : return "OP_WITHIN";

    // crypto
    case OP_RIPEMD160              : return "OP_RIPEMD160";
    case OP_SHA1                   : return "OP_SHA1";
    case OP_SHA256                 : return "OP_SHA256";
    case OP_HASH160                : return "OP_HASH160";
    case OP_HASH256                : return "OP_HASH256";
    case OP_CODESEPARATOR          : return "OP_CODESEPARATOR";
    case OP_CHECKSIG               : return "OP_CHECKSIG";
    case OP_CHECKSIGVERIFY         : return "OP_CHECKSIGVERIFY";
    case OP_CHECKMULTISIG          : return "OP_CHECKMULTISIG";
    case OP_CHECKMULTISIGVERIFY    : return "OP_CHECKMULTISIGVERIFY";

    // expansion
    case OP_NOP1                   : return "OP_NOP1";
    case OP_CHECKLOCKTIMEVERIFY    : return "OP_CHECKLOCKTIMEVERIFY";
    case OP_CHECKSEQUENCEVERIFY    : return "OP_CHECKSEQUENCEVERIFY";
    case OP_NOP4                   : return "OP_NOP4";
    case OP_NOP5                   : return "OP_NOP5";
    case OP_NOP6                   : return "OP_NOP6";
    case OP_NOP7                   : return "OP_NOP7";
    case OP_NOP8                   : return "OP_NOP8";
    case OP_NOP9                   : return "OP_NOP9";
    case OP_NOP10                  : return "OP_NOP10";

    // Opcode added by BIP 342 (Tapscript)
    case OP_CHECKSIGADD            : return "OP_CHECKSIGADD";

    case OP_INVALIDOPCODE          : return "OP_INVALIDOPCODE";

    default:
        return "OP_UNKNOWN";
    }
}